

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranLexer.cxx
# Opt level: O0

void cmFortran_yypop_buffer_state(yyscan_t yyscanner)

{
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  yyguts_t *yyg;
  yyscan_t yyscanner_local;
  
  if (*(long *)((long)yyscanner + 0x28) == 0) {
    local_20 = 0;
  }
  else {
    local_20 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  }
  if (local_20 != 0) {
    if (*(long *)((long)yyscanner + 0x28) == 0) {
      local_28 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_28 = *(YY_BUFFER_STATE *)
                  (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
    }
    cmFortran_yy_delete_buffer(local_28,yyscanner);
    *(undefined8 *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) = 0;
    if (*(long *)((long)yyscanner + 0x18) != 0) {
      *(long *)((long)yyscanner + 0x18) = *(long *)((long)yyscanner + 0x18) + -1;
    }
    if (*(long *)((long)yyscanner + 0x28) == 0) {
      local_30 = 0;
    }
    else {
      local_30 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8
                          );
    }
    if (local_30 != 0) {
      cmFortran_yy_load_buffer_state(yyscanner);
      *(undefined4 *)((long)yyscanner + 0x50) = 1;
    }
  }
  return;
}

Assistant:

void yypop_buffer_state (yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	if (!YY_CURRENT_BUFFER)
		return;

	yy_delete_buffer(YY_CURRENT_BUFFER , yyscanner);
	YY_CURRENT_BUFFER_LVALUE = NULL;
	if (yyg->yy_buffer_stack_top > 0)
		--yyg->yy_buffer_stack_top;

	if (YY_CURRENT_BUFFER) {
		yy_load_buffer_state( yyscanner );
		yyg->yy_did_buffer_switch_on_eof = 1;
	}
}